

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O1

void free_block_hash_buffers(uint32_t *(*block_hash_values) [2],int8_t *(*is_block_same) [3])

{
  int j;
  long lVar1;
  long lVar2;
  bool bVar3;
  
  lVar2 = 0;
  do {
    lVar1 = 0;
    do {
      aom_free((*block_hash_values)[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 == 1);
    lVar1 = 0;
    do {
      aom_free((*is_block_same)[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    block_hash_values = block_hash_values + 1;
    is_block_same = is_block_same + 1;
    bVar3 = lVar2 == 0;
    lVar2 = lVar2 + 1;
  } while (bVar3);
  return;
}

Assistant:

static void free_block_hash_buffers(uint32_t *block_hash_values[2][2],
                                    int8_t *is_block_same[2][3]) {
  for (int k = 0; k < 2; ++k) {
    for (int j = 0; j < 2; ++j) {
      aom_free(block_hash_values[k][j]);
    }

    for (int j = 0; j < 3; ++j) {
      aom_free(is_block_same[k][j]);
    }
  }
}